

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O3

void Abc_RestructNodeDivisors(Abc_ManRst_t *p,Abc_Obj_t *pRoot,int nNodesSaved)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  long *plVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  long lVar10;
  long lVar11;
  
  p->vDecs->nSize = 0;
  pVVar8 = p->vLeaves;
  if (pVVar8->nSize < 1) {
    iVar7 = 0;
  }
  else {
    lVar11 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar11];
      pVVar8 = p->vDecs;
      uVar2 = pVVar8->nSize;
      if (uVar2 == pVVar8->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar8->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc(0x80);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
          }
          pVVar8->pArray = ppvVar9;
          pVVar8->nCap = 0x10;
        }
        else {
          if (pVVar8->pArray == (void **)0x0) {
            ppvVar9 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar2 << 4);
          }
          pVVar8->pArray = ppvVar9;
          pVVar8->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar9 = pVVar8->pArray;
      }
      iVar7 = pVVar8->nSize;
      pVVar8->nSize = iVar7 + 1;
      ppvVar9[iVar7] = pvVar3;
      if ((*(uint *)((long)pvVar3 + 0x14) & 0x40) != 0) {
        __assert_fail("pNode->fMarkC == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRestruct.c"
                      ,0xe2,"void Abc_RestructNodeDivisors(Abc_ManRst_t *, Abc_Obj_t *, int)");
      }
      *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) | 0x40;
      lVar11 = lVar11 + 1;
      pVVar8 = p->vLeaves;
    } while (lVar11 < pVVar8->nSize);
    pVVar8 = p->vDecs;
    iVar7 = pVVar8->nSize;
    if (0 < iVar7) {
      lVar11 = 0;
      do {
        plVar4 = (long *)pVVar8->pArray[lVar11];
        iVar7 = *(int *)((long)plVar4 + 0x2c);
        if (0 < iVar7) {
          lVar10 = 0;
          do {
            plVar5 = *(long **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                               (long)*(int *)(plVar4[6] + lVar10 * 4) * 8);
            if ((*(uint *)((long)plVar5 + 0x14) & 0xf) != 3 &&
                (char)((*(uint *)((long)plVar5 + 0x14) & 0x40) >> 6) == '\0') {
              lVar6 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
              if (((*(byte *)(*(long *)(lVar6 + (long)*(int *)plVar5[4] * 8) + 0x14) & 0x40) != 0)
                 && ((*(byte *)(*(long *)(lVar6 + (long)((int *)plVar5[4])[1] * 8) + 0x14) & 0x40)
                     != 0)) {
                pVVar8 = p->vDecs;
                uVar2 = pVVar8->nSize;
                if (uVar2 == pVVar8->nCap) {
                  if ((int)uVar2 < 0x10) {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc(0x80);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,0x80);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = 0x10;
                  }
                  else {
                    if (pVVar8->pArray == (void **)0x0) {
                      ppvVar9 = (void **)malloc((ulong)uVar2 << 4);
                    }
                    else {
                      ppvVar9 = (void **)realloc(pVVar8->pArray,(ulong)uVar2 << 4);
                    }
                    pVVar8->pArray = ppvVar9;
                    pVVar8->nCap = uVar2 * 2;
                  }
                }
                else {
                  ppvVar9 = pVVar8->pArray;
                }
                iVar7 = pVVar8->nSize;
                pVVar8->nSize = iVar7 + 1;
                ppvVar9[iVar7] = plVar5;
                *(byte *)((long)plVar5 + 0x14) = *(byte *)((long)plVar5 + 0x14) | 0x40;
                iVar7 = *(int *)((long)plVar4 + 0x2c);
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < iVar7);
          pVVar8 = p->vDecs;
        }
        lVar11 = lVar11 + 1;
        iVar7 = pVVar8->nSize;
      } while (lVar11 < iVar7);
      if (0 < iVar7) {
        lVar11 = 0;
        do {
          puVar1 = (uint *)((long)pVVar8->pArray[lVar11] + 0x14);
          *puVar1 = *puVar1 & 0xffffffbf;
          lVar11 = lVar11 + 1;
          pVVar8 = p->vDecs;
          iVar7 = pVVar8->nSize;
        } while (lVar11 < iVar7);
      }
    }
  }
  printf("%d\n",(ulong)(uint)(iVar7 - (nNodesSaved + p->vLeaves->nSize)));
  return;
}

Assistant:

void Abc_RestructNodeDivisors( Abc_ManRst_t * p, Abc_Obj_t * pRoot, int nNodesSaved )
{
    Abc_Obj_t * pNode, * pFanout;//, * pFanin;
    int i, k;
    // start with the leaves
    Vec_PtrClear( p->vDecs );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pNode, i )
    {
        Vec_PtrPush( p->vDecs, pNode );
        assert( pNode->fMarkC == 0 );
        pNode->fMarkC = 1;
    }
    // explore the fanouts
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
    {
        // if the fanout has both fanins in the set, add it
        Abc_ObjForEachFanout( pNode, pFanout, k )
        {
            if ( pFanout->fMarkC || Abc_ObjIsPo(pFanout) )
                continue;
            if ( Abc_ObjFanin0(pFanout)->fMarkC && Abc_ObjFanin1(pFanout)->fMarkC )
            {
                Vec_PtrPush( p->vDecs, pFanout );
                pFanout->fMarkC = 1;
            }
        }
    }
    // unmark the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pNode, i )
        pNode->fMarkC = 0;
/*
    // print the nodes
    Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDecs, pNode, i, Vec_PtrSize(p->vLeaves) )
    {
        printf( "%2d %s = ", i, Abc_NodeIsTravIdCurrent(pNode)? "*" : " " );
        // find the first fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pFanin, k )
            if ( Abc_ObjFanin0(pNode) == pFanin )
                break;
        if ( k < Vec_PtrSize(p->vLeaves) )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC0(pNode)? "\'" : "" );
        // find the second fanin
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vDecs, pFanin, k )
            if ( Abc_ObjFanin1(pNode) == pFanin )
                break;
        if ( k < Vec_PtrSize(p->vLeaves) )
            printf( "%c", 'a' + k );
        else
            printf( "%d", k );
        printf( "%s ", Abc_ObjFaninC1(pNode)? "\'" : "" );
        printf( "\n" );
    }
*/
    printf( "%d\n", Vec_PtrSize(p->vDecs)-nNodesSaved-Vec_PtrSize(p->vLeaves) );
}